

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_schema.c
# Opt level: O0

LY_ERR lys_print_submodule(ly_out *out,lysp_submodule *submodule,LYS_OUTFORMAT format,
                          size_t line_length,uint32_t options)

{
  LY_ERR local_38;
  LY_ERR ret;
  uint32_t options_local;
  size_t line_length_local;
  LYS_OUTFORMAT format_local;
  lysp_submodule *submodule_local;
  ly_out *out_local;
  
  if (out == (ly_out *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","out",
           "lys_print_submodule");
    out_local._4_4_ = LY_EINVAL;
  }
  else if (submodule == (lysp_submodule *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","submodule",
           "lys_print_submodule");
    out_local._4_4_ = LY_EINVAL;
  }
  else {
    out->func_printed = 0;
    if (format == LYS_OUT_YANG) {
      local_38 = yang_print_parsed_submodule(out,submodule,options);
    }
    else if (format == LYS_OUT_YIN) {
      local_38 = yin_print_parsed_submodule(out,submodule,options);
    }
    else if (format == LYS_OUT_TREE) {
      local_38 = tree_print_parsed_submodule(out,submodule,options,line_length);
    }
    else {
      ly_log(submodule->mod->ctx,LY_LLERR,LY_EINVAL,"Unsupported output format.");
      local_38 = LY_EINVAL;
    }
    out_local._4_4_ = local_38;
  }
  return out_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_print_submodule(struct ly_out *out, const struct lysp_submodule *submodule, LYS_OUTFORMAT format,
        size_t line_length, uint32_t options)
{
    LY_ERR ret;

    LY_CHECK_ARG_RET(NULL, out, submodule, LY_EINVAL);

    /* reset number of printed bytes */
    out->func_printed = 0;

    switch (format) {
    case LYS_OUT_YANG:
        ret = yang_print_parsed_submodule(out, submodule, options);
        break;
    case LYS_OUT_YIN:
        ret = yin_print_parsed_submodule(out, submodule, options);
        break;
    case LYS_OUT_TREE:
        ret = tree_print_parsed_submodule(out, submodule, options, line_length);
        break;
    default:
        LOGERR(submodule->mod->ctx, LY_EINVAL, "Unsupported output format.");
        ret = LY_EINVAL;
        break;
    }

    return ret;
}